

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

int zmq::do_setsockopt_int_as_bool_strict(void *optval_,size_t optvallen_,bool *out_value_)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  
  if (optvallen_ == 4) {
    uVar1 = *optval_;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    uVar1 = 0xffffffff;
  }
  iVar3 = -1;
  if (optvallen_ == 4) {
    if (uVar1 < 2) {
      *out_value_ = SUB41(uVar1,0);
      iVar3 = 0;
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
    }
  }
  return iVar3;
}

Assistant:

int zmq::do_setsockopt_int_as_bool_strict (const void *const optval_,
                                           const size_t optvallen_,
                                           bool *const out_value_)
{
    // TODO handling of values other than 0 or 1 is not consistent,
    // here it is disallowed, but for other options such as
    // ZMQ_ROUTER_RAW any positive value is accepted
    int value = -1;
    if (do_setsockopt (optval_, optvallen_, &value) == -1)
        return -1;
    if (value == 0 || value == 1) {
        *out_value_ = (value != 0);
        return 0;
    }
    return sockopt_invalid ();
}